

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void __thiscall CBinds::UnbindAll(CBinds *this)

{
  int m;
  int i;
  CBinds *this_local;
  
  for (i = 0; i < 0x1da; i = i + 1) {
    for (m = 0; m < 4; m = m + 1) {
      this->m_aaaKeyBindings[i][m][0] = '\0';
    }
  }
  return;
}

Assistant:

void CBinds::UnbindAll()
{
	for(int i = 0; i < KEY_LAST; i++)
		for(int m = 0; m < MODIFIER_COUNT; m++)
			m_aaaKeyBindings[i][m][0] = 0;
}